

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::parsing::Token>::emplaceRealloc<slang::parsing::Token_const&>
          (SmallVectorBase<slang::parsing::Token> *this,pointer pos,Token *args)

{
  ulong uVar1;
  undefined8 *puVar2;
  Info *pIVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  Token *__cur_1;
  pointer pTVar7;
  pointer pTVar8;
  pointer pTVar9;
  pointer pTVar10;
  EVP_PKEY_CTX *pEVar11;
  EVP_PKEY_CTX *ctx;
  long lVar12;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar11 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar11 < ctx) {
    pEVar11 = ctx;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    pEVar11 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar12 = (long)pos - (long)this->data_;
  pTVar7 = (pointer)operator_new((long)pEVar11 << 4);
  pIVar3 = args->info;
  *(undefined8 *)((long)pTVar7 + lVar12) = *(undefined8 *)args;
  ((undefined8 *)((long)pTVar7 + lVar12))[1] = pIVar3;
  pTVar10 = this->data_;
  pTVar8 = pTVar10 + this->len;
  pTVar9 = pTVar7;
  if (pTVar8 == pos) {
    for (; pTVar10 != pos; pTVar10 = pTVar10 + 1) {
      uVar4 = pTVar10->field_0x2;
      NVar5.raw = (pTVar10->numFlags).raw;
      uVar6 = pTVar10->rawLen;
      pIVar3 = pTVar10->info;
      pTVar9->kind = pTVar10->kind;
      pTVar9->field_0x2 = uVar4;
      pTVar9->numFlags = (NumericTokenFlags)NVar5.raw;
      pTVar9->rawLen = uVar6;
      pTVar9->info = pIVar3;
      pTVar9 = pTVar9 + 1;
    }
  }
  else {
    for (; pTVar10 != pos; pTVar10 = pTVar10 + 1) {
      uVar4 = pTVar10->field_0x2;
      NVar5.raw = (pTVar10->numFlags).raw;
      uVar6 = pTVar10->rawLen;
      pIVar3 = pTVar10->info;
      pTVar9->kind = pTVar10->kind;
      pTVar9->field_0x2 = uVar4;
      pTVar9->numFlags = (NumericTokenFlags)NVar5.raw;
      pTVar9->rawLen = uVar6;
      pTVar9->info = pIVar3;
      pTVar9 = pTVar9 + 1;
    }
    puVar2 = (undefined8 *)(lVar12 + (long)pTVar7);
    for (; pos != pTVar8; pos = pos + 1) {
      pIVar3 = pos->info;
      puVar2[2] = *(undefined8 *)pos;
      puVar2[3] = pIVar3;
      puVar2 = puVar2 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar11;
  this->data_ = pTVar7;
  return (pointer)((long)pTVar7 + lVar12);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}